

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingState<long,_long>::CalculateDeltaStats(BitpackingState<long,_long> *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long bogus;
  int64_t local_20;
  
  if ((1 < this->compression_buffer_idx) && (this->all_valid == true)) {
    bVar1 = TrySubtractOperator::Operation<long,long,long>(this->minimum,this->maximum,&local_20);
    if ((bVar1) &&
       (bVar1 = TrySubtractOperator::Operation<long,long,long>
                          (this->maximum,this->minimum,&local_20), bVar1)) {
      if (0 < (long)this->compression_buffer_idx) {
        plVar5 = this->compression_buffer;
        lVar2 = 0;
        do {
          this->delta_buffer[lVar2] = plVar5[lVar2] - plVar5[lVar2 + -1];
          lVar2 = lVar2 + 1;
        } while (lVar2 < (long)this->compression_buffer_idx);
      }
    }
    else if (0 < (long)this->compression_buffer_idx) {
      plVar5 = this->delta_buffer;
      lVar2 = 0;
      do {
        bVar1 = TrySubtractOperator::Operation<long,long,long>
                          (this->compression_buffer[lVar2],this->compression_buffer[lVar2 + -1],
                           plVar5);
        if (!bVar1) {
          return;
        }
        lVar2 = lVar2 + 1;
        plVar5 = plVar5 + 1;
      } while (lVar2 < (long)this->compression_buffer_idx);
    }
    this->can_do_delta = true;
    if (1 < this->compression_buffer_idx) {
      lVar2 = this->minimum_delta;
      lVar3 = this->maximum_delta;
      lVar4 = 0;
      do {
        if (lVar3 <= this->delta_buffer[lVar4 + 1]) {
          lVar3 = this->delta_buffer[lVar4 + 1];
        }
        this->maximum_delta = lVar3;
        if (this->delta_buffer[lVar4 + 1] <= lVar2) {
          lVar2 = this->delta_buffer[lVar4 + 1];
        }
        this->minimum_delta = lVar2;
        lVar4 = lVar4 + 1;
      } while (this->compression_buffer_idx - 1 != lVar4);
    }
    this->delta_buffer[0] = this->minimum_delta;
    bVar1 = TrySubtractOperator::Operation<long,long,long>
                      (this->maximum_delta,this->minimum_delta,&this->min_max_delta_diff);
    this->can_do_delta = bVar1;
    if (bVar1) {
      bVar1 = TrySubtractOperator::Operation<long,long,long>
                        (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
    }
    else {
      bVar1 = false;
    }
    this->can_do_delta = bVar1;
  }
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}